

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

size_t Unit::fromText(string *text)

{
  byte bVar1;
  char *pcVar2;
  double dVar3;
  char *unit_ptr;
  byte *local_20;
  
  pcVar2 = (text->_M_dataplus)._M_p;
  dVar3 = strtod(pcVar2,(char **)&local_20);
  if ((long)local_20 - (long)pcVar2 == text->_M_string_length) {
    pcVar2 = "No unit specified";
    goto LAB_00118e56;
  }
  bVar1 = *local_20;
  if (bVar1 < 0x4b) {
    if (bVar1 == 0x42) goto LAB_00118e26;
    if (bVar1 != 0x47) {
LAB_00118e5d:
      do {
        pcVar2 = "Failed to parse size (format: {num}{B/KiB/MiB/GiB}, e.g. 8GiB)";
LAB_00118e56:
        error(pcVar2);
      } while( true );
    }
    dVar3 = dVar3 * 1024.0;
  }
  else if (bVar1 != 0x4d) {
    if (bVar1 != 0x4b) goto LAB_00118e5d;
    dVar3 = dVar3 * 1024.0;
    goto LAB_00118e26;
  }
  dVar3 = dVar3 * 1024.0 * 1024.0;
LAB_00118e26:
  return (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
}

Assistant:

static size_t fromText(const std::string &text) {
        const char *ptr = text.c_str();
        char *unit_ptr;
        double size = strtod(ptr, &unit_ptr);
        if (unit_ptr - ptr == text.size()) {
           error("No unit specified");
        } else if (*unit_ptr == 'B') {
            return B(size);
        } else if (*unit_ptr == 'K') {
            return KiB(size);
        } else if (*unit_ptr == 'M') {
            return MiB(size);
        } else if (*unit_ptr == 'G') {
            return GiB(size);
        }
        error("Failed to parse size (format: {num}{B/KiB/MiB/GiB}, e.g. 8GiB)");
        return 0;
    }